

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O3

bool __thiscall
glslang::TOutputTraverser::visitBranch(TOutputTraverser *this,TVisit param_1,TIntermBranch *node)

{
  int *piVar1;
  TInfoSink *infoSink;
  uint uVar2;
  char *s;
  TInfoSinkBase *this_00;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  this_00 = &infoSink->debug;
  uVar2 = node->flowOp - EOpKill;
  if (uVar2 < 10) {
    s = &DAT_006ef514 + *(int *)(&DAT_006ef514 + (ulong)uVar2 * 4);
  }
  else {
    s = "Branch: Unknown Branch";
  }
  TInfoSinkBase::append(this_00,s);
  if (node->expression == (TIntermTyped *)0x0) {
    TInfoSinkBase::append(this_00,"\n");
  }
  else {
    TInfoSinkBase::append(this_00," with expression\n");
    piVar1 = &(this->super_TIntermTraverser).depth;
    *piVar1 = *piVar1 + 1;
    (*(node->expression->super_TIntermNode)._vptr_TIntermNode[2])(node->expression,this);
    piVar1 = &(this->super_TIntermTraverser).depth;
    *piVar1 = *piVar1 + -1;
  }
  return false;
}

Assistant:

bool TOutputTraverser::visitBranch(TVisit /* visit*/, TIntermBranch* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    switch (node->getFlowOp()) {
    case EOpKill:                   out.debug << "Branch: Kill";                  break;
    case EOpTerminateInvocation:    out.debug << "Branch: TerminateInvocation";   break;
    case EOpIgnoreIntersectionKHR:  out.debug << "Branch: IgnoreIntersectionKHR"; break;
    case EOpTerminateRayKHR:        out.debug << "Branch: TerminateRayKHR";       break;
    case EOpBreak:                  out.debug << "Branch: Break";                 break;
    case EOpContinue:               out.debug << "Branch: Continue";              break;
    case EOpReturn:                 out.debug << "Branch: Return";                break;
    case EOpCase:                   out.debug << "case: ";                        break;
    case EOpDemote:                 out.debug << "Demote";                        break;
    case EOpDefault:                out.debug << "default: ";                     break;
    default:                        out.debug << "Branch: Unknown Branch";        break;
    }

    if (node->getExpression()) {
        out.debug << " with expression\n";
        ++depth;
        node->getExpression()->traverse(this);
        --depth;
    } else
        out.debug << "\n";

    return false;
}